

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.h
# Opt level: O0

void __thiscall
google::protobuf::DescriptorProto::add_reserved_name(DescriptorProto *this,string *value)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  string *value_local;
  DescriptorProto *this_local;
  
  pbVar1 = RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ::Add(&this->reserved_name_);
  std::__cxx11::string::assign((string *)pbVar1);
  return;
}

Assistant:

inline void DescriptorProto::add_reserved_name(const ::std::string& value) {
  reserved_name_.Add()->assign(value);
  // @@protoc_insertion_point(field_add:google.protobuf.DescriptorProto.reserved_name)
}